

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadtriple.c
# Opt level: O3

void dreadtriple(int *m,int *n,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  uint uVar1;
  double *pdVar2;
  int_t *piVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  undefined8 *addr;
  uint *addr_00;
  uint *addr_01;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  uint *puVar13;
  undefined8 *puVar14;
  
  uVar11 = 0;
  __isoc99_scanf("%d%d");
  uVar9 = *n;
  *m = uVar9;
  printf("m %d, n %d, nonz %ld\n",(ulong)uVar9,(ulong)uVar9,(long)*nonz);
  dallocateA(*n,*nonz,nzval,rowind,colptr);
  pdVar2 = *nzval;
  piVar3 = *rowind;
  piVar4 = *colptr;
  addr = (undefined8 *)superlu_malloc((long)*nonz << 3);
  addr_00 = (uint *)int32Malloc(*nonz);
  addr_01 = (uint *)int32Malloc(*nonz);
  if (0 < *n) {
    lVar7 = 0;
    do {
      piVar4[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < *n);
  }
  if (0 < *nonz) {
    uVar11 = 0;
    bVar5 = false;
    puVar12 = addr_00;
    puVar13 = addr_01;
    puVar14 = addr;
    do {
      __isoc99_scanf("%d%d%lf\n",puVar12,puVar13,puVar14);
      if (uVar11 == 0) {
        if ((*addr_00 != 0) && (*addr_01 != 0)) {
          puts("triplet file: row/col indices are one-based.");
          goto LAB_00105bc1;
        }
        puts("triplet file: row/col indices are zero-based.");
        bVar5 = true;
      }
      else {
LAB_00105bc1:
        if (!bVar5) {
          *puVar12 = *puVar12 - 1;
          *puVar13 = *puVar13 - 1;
          bVar5 = false;
        }
      }
      uVar9 = *puVar12;
      if ((int)uVar9 < 0) {
        uVar8 = (ulong)*puVar13;
LAB_00105d26:
        fprintf(_stderr,"nz %d, (%d, %d) = %e out of bound, removed\n",*puVar14,(ulong)uVar11,
                (ulong)uVar9,uVar8);
        exit(-1);
      }
      uVar1 = *puVar13;
      uVar8 = (ulong)uVar1;
      if (((*m <= (int)uVar9) || ((int)uVar1 < 0)) || (*n <= (int)uVar1)) goto LAB_00105d26;
      piVar4[uVar8] = piVar4[uVar8] + 1;
      uVar11 = uVar11 + 1;
      puVar14 = puVar14 + 1;
      puVar13 = puVar13 + 1;
      puVar12 = puVar12 + 1;
    } while ((int)uVar11 < *nonz);
  }
  *nonz = uVar11;
  iVar6 = *piVar4;
  *piVar4 = 0;
  uVar9 = *n;
  if (1 < (int)uVar9) {
    iVar10 = 0;
    lVar7 = 1;
    do {
      iVar10 = iVar10 + iVar6;
      iVar6 = piVar4[lVar7];
      piVar4[lVar7] = iVar10;
      lVar7 = lVar7 + 1;
      uVar9 = *n;
    } while (lVar7 < (int)uVar9);
  }
  if (0 < *nonz) {
    lVar7 = 0;
    do {
      uVar9 = addr_01[lVar7];
      iVar6 = piVar4[(int)uVar9];
      piVar3[iVar6] = addr_00[lVar7];
      pdVar2[iVar6] = (double)addr[lVar7];
      piVar4[(int)uVar9] = piVar4[(int)uVar9] + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < *nonz);
    uVar9 = *n;
  }
  if (0 < (int)uVar9) {
    uVar8 = (ulong)uVar9 + 1;
    do {
      piVar4[uVar8 - 1] = piVar4[uVar8 - 2];
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  *piVar4 = 0;
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(addr_01);
  return;
}

Assistant:

void
dreadtriple(int *m, int *n, int_t *nonz,
	    double **nzval, int_t **rowind, int_t **colptr)
{
/*
 * Output parameters
 * =================
 *   (a,asub,xa): asub[*] contains the row subscripts of nonzeros
 *	in columns of matrix A; a[*] the numerical values;
 *	row i of A is given by a[k],k=xa[i],...,xa[i+1]-1.
 *
 */
    int    j, k, jsize, nnz, nz;
    double *a, *val;
    int_t  *asub, *xa;
    int    *row, *col;
    int    zero_base = 0;

    /*  Matrix format:
     *    First line:  #rows, #cols, #non-zero
     *    Triplet in the rest of lines:
     *                 row, col, value
     */

#ifdef _LONGINT
    scanf("%d%lld", n, nonz);
#else
    scanf("%d%d", n, nonz);
#endif    
    *m = *n;
    printf("m %d, n %d, nonz %ld\n", *m, *n, (long) *nonz);
    dallocateA(*n, *nonz, nzval, rowind, colptr); /* Allocate storage */
    a    = *nzval;
    asub = *rowind;
    xa   = *colptr;

    val = (double *) SUPERLU_MALLOC(*nonz * sizeof(double));
    row = int32Malloc(*nonz);
    col = int32Malloc(*nonz);

    for (j = 0; j < *n; ++j) xa[j] = 0;

    /* Read into the triplet array from a file */
    for (nnz = 0, nz = 0; nnz < *nonz; ++nnz) {
    
	scanf("%d%d%lf\n", &row[nz], &col[nz], &val[nz]);

        if ( nnz == 0 ) { /* first nonzero */
	    if ( row[0] == 0 || col[0] == 0 ) {
		zero_base = 1;
		printf("triplet file: row/col indices are zero-based.\n");
	    } else
		printf("triplet file: row/col indices are one-based.\n");
        }

        if ( !zero_base ) { 
 	  /* Change to 0-based indexing. */
	  --row[nz];
	  --col[nz];
        }

	if (row[nz] < 0 || row[nz] >= *m || col[nz] < 0 || col[nz] >= *n
	    /*|| val[nz] == 0.*/) {
	    fprintf(stderr, "nz %d, (%d, %d) = %e out of bound, removed\n",
		    nz, row[nz], col[nz], val[nz]);
	    exit(-1);
	} else {
	    ++xa[col[nz]];
	    ++nz;
	}
    }

    *nonz = nz;

    /* Initialize the array of column pointers */
    k = 0;
    jsize = xa[0];
    xa[0] = 0;
    for (j = 1; j < *n; ++j) {
	k += jsize;
	jsize = xa[j];
	xa[j] = k;
    }
    
    /* Copy the triplets into the column oriented storage */
    for (nz = 0; nz < *nonz; ++nz) {
	j = col[nz];
	k = xa[j];
	asub[k] = row[nz];
	a[k] = val[nz];
	++xa[j];
    }

    /* Reset the column pointers to the beginning of each column */
    for (j = *n; j > 0; --j)
	xa[j] = xa[j-1];
    xa[0] = 0;

    SUPERLU_FREE(val);
    SUPERLU_FREE(row);
    SUPERLU_FREE(col);

#ifdef CHK_INPUT
    {
	int i;
	for (i = 0; i < *n; i++) {
	    printf("Col %d, xa %d\n", i, xa[i]);
	    for (k = xa[i]; k < xa[i+1]; k++)
		printf("%d\t%16.10f\n", asub[k], a[k]);
	}
    }
#endif

}